

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

void com_lbac_ctx_init(com_lbac_all_ctx_t *sbac_ctx)

{
  long lVar1;
  
  memset(sbac_ctx,0,0x1ac);
  for (lVar1 = 0; lVar1 != 0xd6; lVar1 = lVar1 + 1) {
    sbac_ctx->skip_flag[lVar1] = 0x7fe;
  }
  return;
}

Assistant:

void com_lbac_ctx_init(com_lbac_all_ctx_t *sbac_ctx)
{
    int i, num;
    lbac_ctx_model_t *p;
    memset(sbac_ctx, 0x00, sizeof(*sbac_ctx));

    /* Initialization of the context models */
    num = sizeof(com_lbac_all_ctx_t) / sizeof(lbac_ctx_model_t);
    p = (lbac_ctx_model_t*)sbac_ctx;

    for (i = 0; i < num; i++) {
        p[i] = ((1 << PROB_LPS_BITS_STORE) - 1) << 1;
    }
}